

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QList<QDockWidget_*> * __thiscall
QMainWindowTabBar::dockWidgets(QList<QDockWidget_*> *__return_storage_ptr__,QMainWindowTabBar *this)

{
  int iVar1;
  QDockWidget *t;
  int i;
  int index;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QDockWidget **)0x0;
  (__return_storage_ptr__->d).size = 0;
  index = 0;
  while( true ) {
    iVar1 = QTabBar::count((QTabBar *)this);
    if (iVar1 <= index) break;
    t = dockAt(this,index);
    if (t != (QDockWidget *)0x0) {
      QList<QDockWidget_*>::append(__return_storage_ptr__,t);
    }
    index = index + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QDockWidget *> QMainWindowTabBar::dockWidgets() const
{
    QList<QDockWidget *> docks;
    for (int i = 0; i < count(); ++i) {
        if (QDockWidget *dock = dockAt(i))
            docks << dock;
    }
    return docks;
}